

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void TranslateTypeName(ExpressionTranslateContext *ctx,TypeBase *type)

{
  bool bVar1;
  TypeRef *pTVar2;
  TypeArray *pTVar3;
  TypeUnsizedArray *pTVar4;
  TypeFunction *pTVar5;
  TypeClass *type_00;
  TypeEnum *pTVar6;
  TypeEnum *typeEnum;
  TypeClass *typeClass;
  TypeFunction *typeFunction;
  TypeUnsizedArray *typeUnsizedArray;
  TypeArray *typeArray;
  TypeRef *typeRef;
  TypeBase *type_local;
  ExpressionTranslateContext *ctx_local;
  
  bVar1 = isType<TypeVoid>(type);
  if (bVar1) {
    Print(ctx,"void");
  }
  else {
    bVar1 = isType<TypeBool>(type);
    if (bVar1) {
      Print(ctx,"bool");
    }
    else {
      bVar1 = isType<TypeChar>(type);
      if (bVar1) {
        Print(ctx,"char");
      }
      else {
        bVar1 = isType<TypeShort>(type);
        if (bVar1) {
          Print(ctx,"short");
        }
        else {
          bVar1 = isType<TypeInt>(type);
          if (bVar1) {
            Print(ctx,"int");
          }
          else {
            bVar1 = isType<TypeLong>(type);
            if (bVar1) {
              Print(ctx,"long long");
            }
            else {
              bVar1 = isType<TypeFloat>(type);
              if (bVar1) {
                Print(ctx,"float");
              }
              else {
                bVar1 = isType<TypeDouble>(type);
                if (bVar1) {
                  Print(ctx,"double");
                }
                else {
                  bVar1 = isType<TypeTypeID>(type);
                  if (bVar1) {
                    Print(ctx,"unsigned");
                  }
                  else {
                    bVar1 = isType<TypeFunctionID>(type);
                    if (bVar1) {
                      Print(ctx,"__function");
                    }
                    else {
                      bVar1 = isType<TypeNullptr>(type);
                      if (bVar1) {
                        Print(ctx,"_nullptr");
                      }
                      else {
                        bVar1 = isType<TypeGeneric>(type);
                        if (bVar1) {
                          __assert_fail("!\"generic type TypeGeneric is not translated\"",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                        ,0x9d,
                                        "void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)"
                                       );
                        }
                        bVar1 = isType<TypeGenericAlias>(type);
                        if (bVar1) {
                          __assert_fail("!\"generic type TypeGenericAlias is not translated\"",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                        ,0xa1,
                                        "void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)"
                                       );
                        }
                        bVar1 = isType<TypeAuto>(type);
                        if (bVar1) {
                          __assert_fail("!\"virtual type TypeAuto is not translated\"",
                                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                        ,0xa5,
                                        "void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)"
                                       );
                        }
                        bVar1 = isType<TypeAutoRef>(type);
                        if (bVar1) {
                          Print(ctx,"NULLCRef");
                        }
                        else {
                          bVar1 = isType<TypeAutoArray>(type);
                          if (bVar1) {
                            Print(ctx,"NULLCAutoArray");
                          }
                          else {
                            pTVar2 = getType<TypeRef>(type);
                            if (pTVar2 == (TypeRef *)0x0) {
                              pTVar3 = getType<TypeArray>(type);
                              if (pTVar3 == (TypeArray *)0x0) {
                                pTVar4 = getType<TypeUnsizedArray>(type);
                                if (pTVar4 == (TypeUnsizedArray *)0x0) {
                                  pTVar5 = getType<TypeFunction>(type);
                                  if (pTVar5 == (TypeFunction *)0x0) {
                                    bVar1 = isType<TypeGenericClassProto>(type);
                                    if (bVar1) {
                                      __assert_fail(
                                                  "!\"generic type TypeGenericClassProto is not translated\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                                  ,0xc6,
                                                  "void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)"
                                                  );
                                    }
                                    bVar1 = isType<TypeGenericClass>(type);
                                    if (bVar1) {
                                      __assert_fail(
                                                  "!\"generic type TypeGenericClass is not translated\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                                  ,0xca,
                                                  "void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)"
                                                  );
                                    }
                                    type_00 = getType<TypeClass>(type);
                                    if (type_00 == (TypeClass *)0x0) {
                                      pTVar6 = getType<TypeEnum>(type);
                                      if (pTVar6 == (TypeEnum *)0x0) {
                                        bVar1 = isType<TypeFunctionSet>(type);
                                        if (bVar1) {
                                          __assert_fail(
                                                  "!\"virtual type TypeFunctionSet is not translated\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                                  ,0xd6,
                                                  "void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)"
                                                  );
                                        }
                                        bVar1 = isType<TypeArgumentSet>(type);
                                        if (bVar1) {
                                          __assert_fail(
                                                  "!\"virtual type TypeArgumentSet is not translated\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                                  ,0xda,
                                                  "void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)"
                                                  );
                                        }
                                        bVar1 = isType<TypeMemberSet>(type);
                                        if (bVar1) {
                                          __assert_fail(
                                                  "!\"virtual type TypeMemberSet is not translated\""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                                  ,0xde,
                                                  "void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)"
                                                  );
                                        }
                                        __assert_fail("!\"unknown type\"",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTranslate.cpp"
                                                  ,0xe2,
                                                  "void TranslateTypeName(ExpressionTranslateContext &, TypeBase *)"
                                                  );
                                      }
                                      PrintEscapedName(ctx,(pTVar6->super_TypeStruct).super_TypeBase
                                                           .name);
                                    }
                                    else {
                                      PrintEscapedTypeName(ctx,(TypeBase *)type_00);
                                    }
                                  }
                                  else {
                                    Print(ctx,"NULLCFuncPtr<__typeProxy_");
                                    PrintEscapedName(ctx,(pTVar5->super_TypeBase).name);
                                    Print(ctx,">");
                                  }
                                }
                                else {
                                  Print(ctx,"NULLCArray< ");
                                  TranslateTypeName(ctx,pTVar4->subType);
                                  Print(ctx," >");
                                }
                              }
                              else {
                                PrintEscapedName(ctx,(pTVar3->super_TypeBase).name);
                              }
                            }
                            else {
                              TranslateTypeName(ctx,pTVar2->subType);
                              Print(ctx,"*");
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TranslateTypeName(ExpressionTranslateContext &ctx, TypeBase *type)
{
	if(isType<TypeVoid>(type))
	{
		Print(ctx, "void");
	}
	else if(isType<TypeBool>(type))
	{
		Print(ctx, "bool");
	}
	else if(isType<TypeChar>(type))
	{
		Print(ctx, "char");
	}
	else if(isType<TypeShort>(type))
	{
		Print(ctx, "short");
	}
	else if(isType<TypeInt>(type))
	{
		Print(ctx, "int");
	}
	else if(isType<TypeLong>(type))
	{
		Print(ctx, "long long");
	}
	else if(isType<TypeFloat>(type))
	{
		Print(ctx, "float");
	}
	else if(isType<TypeDouble>(type))
	{
		Print(ctx, "double");
	}
	else if(isType<TypeTypeID>(type))
	{
		Print(ctx, "unsigned");
	}
	else if(isType<TypeFunctionID>(type))
	{
		Print(ctx, "__function");
	}
	else if(isType<TypeNullptr>(type))
	{
		Print(ctx, "_nullptr");
	}
	else if(isType<TypeGeneric>(type))
	{
		assert(!"generic type TypeGeneric is not translated");
	}
	else if(isType<TypeGenericAlias>(type))
	{
		assert(!"generic type TypeGenericAlias is not translated");
	}
	else if(isType<TypeAuto>(type))
	{
		assert(!"virtual type TypeAuto is not translated");
	}
	else if(isType<TypeAutoRef>(type))
	{
		Print(ctx, "NULLCRef");
	}
	else if(isType<TypeAutoArray>(type))
	{
		Print(ctx, "NULLCAutoArray");
	}
	else if(TypeRef *typeRef = getType<TypeRef>(type))
	{
		TranslateTypeName(ctx, typeRef->subType);
		Print(ctx, "*");
	}
	else if(TypeArray *typeArray = getType<TypeArray>(type))
	{
		PrintEscapedName(ctx, typeArray->name);
	}
	else if(TypeUnsizedArray *typeUnsizedArray = getType<TypeUnsizedArray>(type))
	{
		Print(ctx, "NULLCArray< ");
		TranslateTypeName(ctx, typeUnsizedArray->subType);
		Print(ctx, " >");
	}
	else if(TypeFunction *typeFunction = getType<TypeFunction>(type))
	{
		Print(ctx, "NULLCFuncPtr<__typeProxy_");
		PrintEscapedName(ctx, typeFunction->name);
		Print(ctx, ">");
	}
	else if(isType<TypeGenericClassProto>(type))
	{
		assert(!"generic type TypeGenericClassProto is not translated");
	}
	else if(isType<TypeGenericClass>(type))
	{
		assert(!"generic type TypeGenericClass is not translated");
	}
	else if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		PrintEscapedTypeName(ctx, typeClass);
	}
	else if(TypeEnum *typeEnum = getType<TypeEnum>(type))
	{
		PrintEscapedName(ctx, typeEnum->name);
	}
	else if(isType<TypeFunctionSet>(type))
	{
		assert(!"virtual type TypeFunctionSet is not translated");
	}
	else if(isType<TypeArgumentSet>(type))
	{
		assert(!"virtual type TypeArgumentSet is not translated");
	}
	else if(isType<TypeMemberSet>(type))
	{
		assert(!"virtual type TypeMemberSet is not translated");
	}
	else
	{
		assert(!"unknown type");
	}
}